

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int codebook_decode(vorb *f,Codebook *c,float *output,int len)

{
  int iVar1;
  float fVar2;
  float last_1;
  float val;
  float last;
  int z;
  int i;
  int len_local;
  float *output_local;
  Codebook *c_local;
  vorb *f_local;
  
  iVar1 = codebook_decode_start(f,c);
  if (iVar1 < 0) {
    f_local._4_4_ = 0;
  }
  else {
    z = len;
    if (c->dimensions < len) {
      z = c->dimensions;
    }
    iVar1 = c->dimensions * iVar1;
    if (c->sequence_p == '\0') {
      for (last = 0.0; (int)last < z; last = (float)((int)last + 1)) {
        output[(int)last] = c->multiplicands[iVar1 + (int)last] + 0.0 + output[(int)last];
      }
    }
    else {
      last_1 = 0.0;
      for (last = 0.0; (int)last < z; last = (float)((int)last + 1)) {
        fVar2 = c->multiplicands[iVar1 + (int)last] + last_1;
        output[(int)last] = fVar2 + output[(int)last];
        last_1 = fVar2 + c->minimum_value;
      }
    }
    f_local._4_4_ = 1;
  }
  return f_local._4_4_;
}

Assistant:

static int codebook_decode(vorb *f, Codebook *c, float *output, int len)
{
   int i,z = codebook_decode_start(f,c);
   if (z < 0) return FALSE;
   if (len > c->dimensions) len = c->dimensions;

#ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
   if (c->lookup_type == 1) {
      float last = CODEBOOK_ELEMENT_BASE(c);
      int div = 1;
      for (i=0; i < len; ++i) {
         int off = (z / div) % c->lookup_values;
         float val = CODEBOOK_ELEMENT_FAST(c,off) + last;
         output[i] += val;
         if (c->sequence_p) last = val + c->minimum_value;
         div *= c->lookup_values;
      }
      return TRUE;
   }
#endif

   z *= c->dimensions;
   if (c->sequence_p) {
      float last = CODEBOOK_ELEMENT_BASE(c);
      for (i=0; i < len; ++i) {
         float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
         output[i] += val;
         last = val + c->minimum_value;
      }
   } else {
      float last = CODEBOOK_ELEMENT_BASE(c);
      for (i=0; i < len; ++i) {
         output[i] += CODEBOOK_ELEMENT_FAST(c,z+i) + last;
      }
   }

   return TRUE;
}